

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O2

int main(void)

{
  bool bVar1;
  bool bVar2;
  bool bVar4;
  int iVar5;
  int iVar6;
  ImU32 col;
  GLFWwindow *handle;
  ostream *poVar7;
  GLubyte *pGVar8;
  ImGuiIO *pIVar9;
  bool bVar3;
  bool *pbVar10;
  size_t sVar11;
  State *pSVar12;
  ImDrawList *this;
  ImDrawData *draw_data;
  size_t i;
  char *pcVar13;
  size_t i_1;
  float fVar14;
  float fVar15;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar16;
  float in_XMM1_Dc;
  float in_XMM1_Dd;
  IndexRange IVar17;
  IndexRange IVar18;
  rectf rVar19;
  ImVec2 local_e8;
  ImVec2 local_e0;
  double mouse_y;
  double mouse_x;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  State local_a8;
  
  iVar5 = glfwInit();
  iVar6 = 1;
  if (iVar5 != 0) {
    glfwWindowHint(0x22002,3);
    glfwWindowHint(0x22003,3);
    glfwWindowHint(0x22008,0x32001);
    handle = glfwCreateWindow(0x280,0x1e0,"My Title",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
    if (handle != (GLFWwindow *)0x0) {
      glfwMakeContextCurrent(handle);
      glfwSwapInterval(1);
      gladLoadGLLoader(glfwGetProcAddress);
      poVar7 = std::operator<<((ostream *)&std::cout,"OpenGL: ");
      pGVar8 = (*glad_glGetString)(0x1f02);
      poVar7 = std::operator<<(poVar7,(char *)pGVar8);
      std::operator<<(poVar7,"\n");
      ImGui::CreateContext((ImFontAtlas *)0x0);
      ImGui::StyleColorsDark((ImGuiStyle *)0x0);
      ImGui_ImplGlfw_InitForOpenGL(handle,true);
      ImGui_ImplOpenGL3_Init((char *)0x0);
      State::add_box(&state,(float2)0x42c8000042c80000);
      State::add_box(&state,(float2)0x4348000043c80000);
      push_undo_step();
      bVar4 = false;
      while( true ) {
        iVar6 = glfwWindowShouldClose(handle);
        if (iVar6 != 0) break;
        glfwPollEvents();
        glfwGetCursorPos(handle,&mouse_x,&mouse_y);
        fVar14 = (float)mouse_x;
        fVar15 = (float)mouse_y;
        pIVar9 = ImGui::GetIO();
        bVar1 = pIVar9->WantCaptureMouse;
        if (bVar1 == false) {
          iVar6 = glfwGetMouseButton(handle,0);
          if (iVar6 == 1) {
            IVar17 = bas::Vector<float2,_4UL,_bas::RawAllocator>::index_range(&state.box_positions);
            while( true ) {
              sVar11 = IVar17.m_start;
              if (IVar17.m_size == 0) break;
              rVar19 = State::get_box_rect(&state,sVar11);
              fVar16 = rVar19.ymax;
              if ((((rVar19.xmin <= fVar14) && (fVar14 <= rVar19.xmax)) && (rVar19.ymin <= fVar15))
                 && (in_XMM1_Dc = fVar16, in_XMM1_Dd = fVar16, fVar15 <= fVar16)) {
                pbVar10 = bas::Vector<bool,_4UL,_bas::RawAllocator>::operator[]
                                    (&state.box_selections,sVar11);
                *pbVar10 = true;
                in_XMM1_Dc = fVar16;
              }
              IVar17.m_size = IVar17.m_size - 1;
              IVar17.m_start = sVar11 + 1;
            }
          }
        }
        bVar2 = is_key_down(handle,0x5a);
        bVar3 = is_key_down(handle,0x155);
        if (bVar4 == false && !(bool)(~(bVar3 && bVar2) & 1)) {
          sVar11 = bas::Vector<State,_4UL,_bas::RawAllocator>::size(&undo_stack.m_elements);
          pcVar13 = "End of undo stack\n";
          if (1 < sVar11) {
            bas::Vector<State,_4UL,_bas::RawAllocator>::pop_last(&local_a8,&undo_stack.m_elements);
            State::~State(&local_a8);
            pSVar12 = bas::Stack<State,_4UL,_bas::RawAllocator>::peek(&undo_stack);
            State::operator=(&state,pSVar12);
            pcVar13 = "Pop undo step\n";
          }
          std::operator<<((ostream *)&std::cout,pcVar13);
        }
        ImGui_ImplOpenGL3_NewFrame();
        ImGui_ImplGlfw_NewFrame();
        ImGui::NewFrame();
        this = ImGui::GetBackgroundDrawList();
        IVar18 = bas::Vector<float2,_4UL,_bas::RawAllocator>::index_range(&state.box_positions);
        while( true ) {
          sVar11 = IVar18.m_start;
          if (IVar18.m_size == 0) break;
          rVar19 = State::get_box_rect(&state,sVar11);
          local_b8._8_4_ = extraout_XMM0_Dc;
          local_b8._0_8_ = rVar19._0_8_;
          local_b8._12_4_ = extraout_XMM0_Dd;
          local_c8._8_4_ = in_XMM1_Dc;
          local_c8._0_8_ = rVar19._8_8_;
          local_c8._12_4_ = in_XMM1_Dd;
          local_a8.box_positions.m_begin = (float2 *)0x3ea0a0a13f66e6e8;
          local_a8.box_positions.m_end = (float2 *)0x3f8000003ea0a0a1;
          pbVar10 = bas::Vector<bool,_4UL,_bas::RawAllocator>::operator[]
                              (&state.box_selections,sVar11);
          if (*pbVar10 == true) {
            local_a8.box_positions.m_begin =
                 (float2 *)
                 CONCAT44(local_a8.box_positions.m_begin._4_4_,
                          local_a8.box_positions.m_begin._0_4_ * 0.6);
          }
          if (bVar1 == false) {
            in_XMM1_Dc = 0.0;
            in_XMM1_Dd = 0.0;
            if (((float)local_b8._0_4_ <= fVar14) && (fVar14 <= (float)local_b8._4_4_)) {
              in_XMM1_Dc = 0.0;
              in_XMM1_Dd = 0.0;
              if (((float)local_c8._0_4_ <= fVar15) &&
                 (in_XMM1_Dc = (float)local_c8._4_4_, in_XMM1_Dd = (float)local_c8._4_4_,
                 fVar15 <= (float)local_c8._4_4_)) {
                in_XMM1_Dc = 0.0;
                in_XMM1_Dd = 0.0;
                local_a8.box_positions.m_begin =
                     (float2 *)
                     CONCAT44(local_a8.box_positions.m_begin._4_4_,
                              local_a8.box_positions.m_begin._0_4_ * 0.8);
              }
            }
          }
          local_e0.y = (float)local_c8._4_4_;
          local_e0.x = (float)local_b8._0_4_;
          local_e8.y = (float)local_c8._0_4_;
          local_e8.x = (float)local_b8._4_4_;
          col = ImGui::ColorConvertFloat4ToU32((ImVec4 *)&local_a8);
          ImDrawList::AddRectFilled(this,&local_e0,&local_e8,col,0.0,0xf);
          IVar18.m_size = IVar18.m_size - 1;
          IVar18.m_start = sVar11 + 1;
        }
        ImGui::Begin("Other Window",(bool *)0x0,0);
        ImGui::SliderInt("A",&state.a,0,100,"%d");
        bVar4 = ImGui::IsItemDeactivatedAfterEdit();
        if (bVar4) {
          push_undo_step();
        }
        ImGui::End();
        ImGui::Render();
        (*glad_glClear)(0x4100);
        draw_data = ImGui::GetDrawData();
        ImGui_ImplOpenGL3_RenderDrawData(draw_data);
        glfwSwapBuffers(handle);
        bVar4 = bVar2;
      }
      ImGui_ImplGlfw_Shutdown();
      glfwDestroyWindow(handle);
      glfwTerminate();
      iVar6 = 0;
    }
  }
  return iVar6;
}

Assistant:

int main()
{
    if (!glfwInit()) {
        return 1;
    }

    glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 3);
    glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 3);
    glfwWindowHint(GLFW_OPENGL_PROFILE, GLFW_OPENGL_CORE_PROFILE);

    GLFWwindow *window = glfwCreateWindow(
        640, 480, "My Title", nullptr, nullptr);
    if (window == nullptr) {
        return 1;
    }
    glfwMakeContextCurrent(window);
    glfwSwapInterval(1);

    gladLoadGLLoader((GLADloadproc)glfwGetProcAddress);
    std::cout << "OpenGL: " << glGetString(GL_VERSION) << "\n";

    ImGui::CreateContext();
    ImGui::StyleColorsDark();
    ImGui_ImplGlfw_InitForOpenGL(window, true);
    ImGui_ImplOpenGL3_Init(nullptr);

    bool z_was_down = false;

    // double last_mouse_x = 0.0f;
    // double last_mouse_y = 0.0f;

    state.add_box({100, 100});
    state.add_box({400, 200});
    push_undo_step();

    while (!glfwWindowShouldClose(window)) {
        glfwPollEvents();

        double mouse_x, mouse_y;
        glfwGetCursorPos(window, &mouse_x, &mouse_y);
        float2 mouse_position = {(float)mouse_x, (float)mouse_y};

        bool imgui_uses_mouse = ImGui::GetIO().WantCaptureMouse;

        if (!imgui_uses_mouse) {
            if (glfwGetMouseButton(window, GLFW_MOUSE_BUTTON_LEFT) ==
                GLFW_PRESS) {
                for (size_t i : state.box_positions.index_range()) {
                    if (state.get_box_rect(i).contains(mouse_position)) {
                        state.box_selections[i] = true;
                    }
                }
            }
        }

        bool z_is_down = is_key_down(window, GLFW_KEY_Z);

        if (is_key_down(window, GLFW_KEY_LEFT_CONTROL) && !z_was_down &&
            z_is_down) {
            pop_undo_step();
        }

        ImGui_ImplOpenGL3_NewFrame();
        ImGui_ImplGlfw_NewFrame();

        ImGui::NewFrame();

        {
            ImDrawList *draw_list = ImGui::GetBackgroundDrawList();
            for (size_t i : state.box_positions.index_range()) {
                rectf box = state.get_box_rect(i);
                ImColor color = ImColor(230, 80, 80);
                if (state.box_selections[i]) {
                    color.Value.x *= 0.6f;
                }
                if (!imgui_uses_mouse && box.contains(mouse_position)) {
                    color.Value.x *= 0.8f;
                }

                draw_list->AddRectFilled(
                    to_im(box.upper_left()), to_im(box.lower_right()), color);
            }
        }

        // ImGui::SetNextWindowPos({0, 0});
        // int width, height;
        // glfwGetWindowSize(window, &width, &height);
        // ImGui::SetNextWindowSize({(float)width, (float)height});
        // ImGui::PushStyleVar(ImGuiStyleVar_WindowBorderSize, 0.0f);

        // ImGui::Begin("My Window",
        //              nullptr,
        //              ImGuiWindowFlags_NoDecoration |
        //                  ImGuiWindowFlags_NoBringToFrontOnFocus |
        //                  ImGuiWindowFlags_NoInputs);

        // // rect_pos_x = mouse_x;
        // ImDrawList *draw_list = ImGui::GetWindowDrawList();
        // if (!ImGui::GetIO().WantCaptureMouse &&
        //     glfwGetMouseButton(window, GLFW_MOUSE_BUTTON_LEFT) ==
        //     GLFW_PRESS) { BAS_UNUSED_VAR(last_mouse_y); rect_pos_x +=
        //     mouse_x - last_mouse_x;
        // }

        // draw_list->AddRectFilled({rect_pos_x, 10},
        //                          {rect_pos_x + 100, 200},
        //                          ImColor(0.8f, 0.8f, 0.3f));
        // const char *text = "Hello World";
        // draw_list->AddText({rect_pos_x, 100}, IM_COL32_WHITE, text, text +
        // 8);

        // ImDrawList *foreground_list = ImGui::GetForegroundDrawList();
        // foreground_list->AddLine({0, 0}, {300, 300}, ImColor(255, 0, 0), 4);

        // ImGui::End();

        // ImGui::PopStyleVar();

        ImGui::Begin("Other Window");
        ImGui::SliderInt("A", &state.a, 0, 100);
        push_undo_after_edit();
        ImGui::End();

        ImGui::Render();

        glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
        ImGui_ImplOpenGL3_RenderDrawData(ImGui::GetDrawData());
        glfwSwapBuffers(window);

        z_was_down = z_is_down;
        // last_mouse_x = mouse_x;
        // last_mouse_y = mouse_y;
    }

    ImGui_ImplGlfw_Shutdown();
    glfwDestroyWindow(window);
    glfwTerminate();

    return 0;
}